

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::read_exponent_and_suffix
          (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this)

{
  Position *this_00;
  char cVar1;
  int iVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  pbVar4 = (byte *)(this->m_position).m_pos;
  pbVar6 = (byte *)(this->m_position).m_end;
  bVar3 = true;
  if (pbVar4 == pbVar6) {
    return true;
  }
  this_00 = &this->m_position;
  iVar2 = tolower((int)(char)*pbVar4);
  if (iVar2 == 0x65) {
    Position::operator++(this_00);
    pbVar7 = (byte *)(this->m_position).m_pos;
    pbVar5 = (byte *)(this->m_position).m_end;
    if (pbVar7 != pbVar5) {
      if ((*pbVar7 == 0x2d) || (*pbVar7 == 0x2b)) {
        Position::operator++(this_00);
        pbVar7 = (byte *)(this->m_position).m_pos;
        pbVar5 = (byte *)(this->m_position).m_end;
      }
      if (pbVar7 != pbVar5) {
        cVar1 = m_alphabet._M_elems[2]._M_elems[*pbVar7];
        pbVar4 = pbVar7;
        while (pbVar6 = pbVar5, cVar1 == '\x01') {
          Position::operator++(this_00);
          pbVar4 = (byte *)(this->m_position).m_pos;
          pbVar5 = (byte *)(this->m_position).m_end;
          pbVar6 = pbVar4;
          if (pbVar4 == pbVar5) break;
          cVar1 = m_alphabet._M_elems[2]._M_elems[*pbVar4];
        }
        if (pbVar4 != pbVar7) goto LAB_0034365d;
      }
    }
    bVar3 = false;
  }
  else {
LAB_0034365d:
    if (pbVar4 != pbVar6) {
      do {
        if (m_alphabet._M_elems[0xb]._M_elems[*pbVar4] != true) {
          return true;
        }
        Position::operator++(this_00);
        pbVar4 = (byte *)(this->m_position).m_pos;
      } while (pbVar4 != (byte *)(this->m_position).m_end);
    }
  }
  return bVar3;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }